

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenAtomicFence(BinaryenModuleRef module)

{
  AtomicFence *pAVar1;
  
  pAVar1 = MixedArena::alloc<wasm::AtomicFence>(&module->allocator);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicFence(BinaryenModuleRef module) {
  return static_cast<Expression*>(Builder(*(Module*)module).makeAtomicFence());
}